

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O2

bool __thiscall QFileSystemModel::isDir(QFileSystemModel *this,QModelIndex *index)

{
  QFileSystemModelPrivate *this_00;
  bool bVar1;
  undefined1 uVar2;
  QFileSystemNode *this_01;
  long in_FS_OFFSET;
  QFileInfo local_30 [8];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileSystemModelPrivate **)&this->field_0x8;
  bVar1 = QModelIndex::isValid(index);
  uVar2 = 1;
  if (bVar1) {
    this_01 = QFileSystemModelPrivate::node(this_00,index);
    if (this_01->info != (QExtendedInformation *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        bVar1 = QFileSystemModelPrivate::QFileSystemNode::isDir(this_01);
        return bVar1;
      }
      goto LAB_0056e917;
    }
    fileInfo((QFileSystemModel *)local_30,(QModelIndex *)this);
    uVar2 = QFileInfo::isDir();
    QFileInfo::~QFileInfo(local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (bool)uVar2;
  }
LAB_0056e917:
  __stack_chk_fail();
}

Assistant:

bool QFileSystemModel::isDir(const QModelIndex &index) const
{
    // This function is for public usage only because it could create a file info
    Q_D(const QFileSystemModel);
    if (!index.isValid())
        return true;
    QFileSystemModelPrivate::QFileSystemNode *n = d->node(index);
    if (n->hasInformation())
        return n->isDir();
    return fileInfo(index).isDir();
}